

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::ExistingFileNamer::ExistingFileNamer
          (ExistingFileNamer *this,string *filePath_,Options *options)

{
  _func_int **in_RDX;
  string *in_RSI;
  ApprovalNamer *in_RDI;
  
  ApprovalNamer::ApprovalNamer(in_RDI);
  in_RDI->_vptr_ApprovalNamer = (_func_int **)&PTR__ExistingFileNamer_002c55d8;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  in_RDI[5]._vptr_ApprovalNamer = in_RDX;
  return;
}

Assistant:

ExistingFileNamer::ExistingFileNamer(std::string filePath_, const Options& options)
        : filePath(std::move(filePath_)), options_(options)
    {
    }